

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O1

void __thiscall
kj::TimerImpl::TimerPromiseAdapter::TimerPromiseAdapter
          (TimerPromiseAdapter *this,PromiseFulfiller<void> *fulfiller,TimerImpl *parent,
          TimePoint time)

{
  SleepHooks *pSVar1;
  iterator iVar2;
  TimerPromiseAdapter *local_30;
  undefined1 local_28;
  Quantity<long,_kj::_::NanosecondLabel> local_20;
  
  (this->time).value.value = (long)time.value.value;
  this->fulfiller = fulfiller;
  this->parent = parent;
  (this->pos)._M_node = (_Base_ptr)0x0;
  local_30 = this;
  iVar2 = std::
          _Rb_tree<kj::TimerImpl::TimerPromiseAdapter*,kj::TimerImpl::TimerPromiseAdapter*,std::_Identity<kj::TimerImpl::TimerPromiseAdapter*>,kj::TimerImpl::Impl::TimerBefore,std::allocator<kj::TimerImpl::TimerPromiseAdapter*>>
          ::_M_insert_equal<kj::TimerImpl::TimerPromiseAdapter*>
                    ((_Rb_tree<kj::TimerImpl::TimerPromiseAdapter*,kj::TimerImpl::TimerPromiseAdapter*,std::_Identity<kj::TimerImpl::TimerPromiseAdapter*>,kj::TimerImpl::Impl::TimerBefore,std::allocator<kj::TimerImpl::TimerPromiseAdapter*>>
                      *)(parent->impl).ptr,&local_30);
  (this->pos)._M_node = iVar2._M_node;
  pSVar1 = (parent->sleepHooks).ptr;
  if ((pSVar1 != (SleepHooks *)0x0) &&
     (iVar2._M_node ==
      (((parent->impl).ptr)->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)) {
    local_28 = 1;
    local_20 = time.value.value;
    (**pSVar1->_vptr_SleepHooks)();
  }
  return;
}

Assistant:

TimerPromiseAdapter(PromiseFulfiller<void>& fulfiller, TimerImpl& parent, TimePoint time)
      : time(time), fulfiller(fulfiller), parent(parent) {
    pos = parent.impl->timers.insert(this);

    KJ_IF_SOME(h, parent.sleepHooks) {
      if (pos == parent.impl->timers.begin()) {
        h.updateNextTimerEvent(time);
      }
    }
  }